

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

size_t n_occurences(int *array,size_t length,int needle)

{
  size_t sVar1;
  size_t sVar2;
  
  if (length != 0) {
    sVar2 = 0;
    sVar1 = 0;
    do {
      sVar1 = sVar1 + (array[sVar2] == needle);
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t n_occurences(const int* array, const size_t length, const int needle) {
  size_t sum = 0;
  for (size_t i = 0; i < length; i++) {
    if (array[i] == needle) {
      sum++;
    }
  }
  return sum;
}